

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzD::NodeIntStateScatter
          (ChNodeFEAxyzD *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double T)

{
  ChVector<double> local_c8;
  ChVector<double> local_a8;
  ChVector<double> local_88;
  MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_68 [56];
  
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
             &x->super_ChVectorDynamic<double>,(ulong)off_x,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_c8,local_68,(type *)0x0);
  if ((ChVector<double> *)&(this->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20 != &local_c8) {
    *(double *)&(this->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20 = local_c8.m_data[0];
    *(double *)&(this->super_ChNodeFEAxyz).field_0x28 = local_c8.m_data[1];
    *(double *)&(this->super_ChNodeFEAxyz).field_0x30 = local_c8.m_data[2];
  }
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
             &x->super_ChVectorDynamic<double>,(ulong)(off_x + 3),3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_88,local_68,(type *)0x0);
  if ((ChVector<double> *)&(this->super_ChNodeFEAxyz).field_0xf0 != &local_88) {
    *(double *)&(this->super_ChNodeFEAxyz).field_0xf0 = local_88.m_data[0];
    *(double *)&this->field_0xf8 = local_88.m_data[1];
    *(double *)&this->field_0x100 = local_88.m_data[2];
  }
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
             &v->super_ChVectorDynamic<double>,(ulong)off_v,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_c8,local_68,(type *)0x0);
  if ((ChVector<double> *)&(this->super_ChNodeFEAxyz).field_0x38 != &local_c8) {
    *(double *)&(this->super_ChNodeFEAxyz).field_0x38 = local_c8.m_data[0];
    *(double *)&(this->super_ChNodeFEAxyz).field_0x40 = local_c8.m_data[1];
    *(double *)&(this->super_ChNodeFEAxyz).field_0x48 = local_c8.m_data[2];
  }
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
             &v->super_ChVectorDynamic<double>,(ulong)(off_v + 3),3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_a8,local_68,(type *)0x0);
  if (&this->D_dt != &local_a8) {
    (this->D_dt).m_data[0] = local_a8.m_data[0];
    (this->D_dt).m_data[1] = local_a8.m_data[1];
    (this->D_dt).m_data[2] = local_a8.m_data[2];
  }
  return;
}

Assistant:

void ChNodeFEAxyzD::NodeIntStateScatter(const unsigned int off_x,
                                        const ChState& x,
                                        const unsigned int off_v,
                                        const ChStateDelta& v,
                                        const double T) {
    SetPos(x.segment(off_x, 3));
    SetD(x.segment(off_x + 3, 3));
    SetPos_dt(v.segment(off_v, 3));
    SetD_dt(v.segment(off_v + 3, 3));
}